

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

uint32_t load4(uchar *in)

{
  uint32_t ret;
  int i;
  uchar *in_local;
  
  ret = (uint32_t)in[3];
  for (i = 2; -1 < i; i = i + -1) {
    ret = (uint)in[i] | ret << 8;
  }
  return ret;
}

Assistant:

uint32_t load4(const unsigned char * in)
{
	int i;
	uint32_t ret = in[3];

	for (i = 2; i >= 0; i--)
	{
		ret <<= 8;
		ret |= in[i];
	}

	return ret;
}